

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool __thiscall libcellml::Variable::doEquals(Variable *this,EntityPtr *other)

{
  EntityImpl *pEVar1;
  Entity *this_00;
  string *psVar2;
  bool bVar3;
  __type _Var4;
  byte unaff_BPL;
  shared_ptr<libcellml::Variable> variable;
  shared_ptr<libcellml::Entity> local_78;
  string local_68;
  string local_48;
  
  bVar3 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (bVar3) {
    std::dynamic_pointer_cast<libcellml::Variable,libcellml::Entity>(&local_78);
    bVar3 = true;
    if ((Variable *)
        local_78.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (Variable *)0x0) {
      pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      initialValue_abi_cxx11_
                (&local_68,
                 (Variable *)
                 local_78.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pEVar1[6].mId.field_2,&local_68);
      if (_Var4) {
        pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        interfaceType_abi_cxx11_
                  (&local_48,
                   (Variable *)
                   local_78.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pEVar1[7].mId.field_2,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        if (_Var4) {
          this_00 = (Entity *)
                    (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[8].mId.
                    field_2._M_allocated_capacity;
          if (this_00 == (Entity *)0x0) {
            units((Variable *)&local_68);
            unaff_BPL = local_68._M_dataplus._M_p == (pointer)0x0;
            psVar2 = &local_68;
          }
          else {
            units((Variable *)&local_48);
            psVar2 = &local_48;
            local_68._M_dataplus._M_p = local_48._M_dataplus._M_p;
            local_68._M_string_length = local_48._M_string_length;
            local_48._M_dataplus._M_p = (pointer)0x0;
            local_48._M_string_length = 0;
            unaff_BPL = Entity::equals(this_00,(EntityPtr *)&local_68);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
          bVar3 = false;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar3) goto LAB_0022ca26;
  }
  unaff_BPL = 0;
LAB_0022ca26:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool Variable::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto variable = std::dynamic_pointer_cast<libcellml::Variable>(other);
        if ((variable != nullptr)
            && pFunc()->mInitialValue == variable->initialValue()
            && pFunc()->mInterfaceType == variable->interfaceType()) {
            if (pFunc()->mUnits != nullptr) {
                return pFunc()->mUnits->equals(variable->units());
            }

            return variable->units() == nullptr;
        }
    }
    return false;
}